

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O3

void __thiscall
gss::innards::Lackey::Lackey
          (Lackey *this,string *send_to_name,string *read_from_name,InputGraph *pattern_graph,
          InputGraph *target_graph)

{
  _Head_base<0UL,_gss::innards::Lackey::Imp_*,_false> _Var1;
  DisobedientLackeyError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _Var1._M_head_impl = (Imp *)operator_new(0x460);
  *(undefined8 *)((long)&(_Var1._M_head_impl)->external_solver_mutex + 0x20) = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->external_solver_mutex = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->external_solver_mutex + 8) = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->external_solver_mutex + 0x10) = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->external_solver_mutex + 0x18) = 0;
  std::ofstream::ofstream(&(_Var1._M_head_impl)->send_to,(string *)send_to_name,_S_out);
  std::ifstream::ifstream(&(_Var1._M_head_impl)->read_from,(string *)read_from_name,_S_in);
  (_Var1._M_head_impl)->pattern_graph = pattern_graph;
  (_Var1._M_head_impl)->target_graph = target_graph;
  (_Var1._M_head_impl)->number_of_checks = 0;
  (_Var1._M_head_impl)->number_of_propagations = 0;
  (_Var1._M_head_impl)->number_of_deletions = 0;
  (_Var1._M_head_impl)->number_of_calls = 0;
  (this->_imp)._M_t.
  super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>.
  _M_t.
  super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
  .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (((*(byte *)((long)&(_Var1._M_head_impl)->field_0x248 +
                 *(long *)(*(long *)&(_Var1._M_head_impl)->read_from + -0x18)) & 5) == 0) &&
     ((*(byte *)((long)&(_Var1._M_head_impl)->field_0x48 +
                *(long *)(*(long *)&(_Var1._M_head_impl)->send_to + -0x18)) & 5) == 0)) {
    return;
  }
  this_00 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
  std::operator+(&local_90,"error setting up lackey communication using ",send_to_name);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90," and ");
  paVar3 = &pbVar2->field_2;
  local_70._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_70.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_50,&local_70,read_from_name);
  DisobedientLackeyError::DisobedientLackeyError(this_00,&local_50);
  __cxa_throw(this_00,&DisobedientLackeyError::typeinfo,
              DisobedientLackeyError::~DisobedientLackeyError);
}

Assistant:

Lackey::Lackey(const string & send_to_name, const string & read_from_name,
    const InputGraph & pattern_graph, const InputGraph & target_graph) :
    _imp(new Imp{{}, ofstream{send_to_name}, ifstream{read_from_name}, pattern_graph, target_graph})
{
    if ((! _imp->read_from) || (! _imp->send_to))
        throw DisobedientLackeyError{"error setting up lackey communication using " + send_to_name + " and " + read_from_name};
}